

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFSInv.h
# Opt level: O2

bool dg::pta::PointerAnalysisFSInv::handleInvalidateLocals(PSNode *node)

{
  undefined8 *puVar1;
  bool bVar2;
  bool bVar3;
  undefined8 *puVar4;
  
  puVar1 = *(undefined8 **)(node + 0x48);
  bVar3 = false;
  for (puVar4 = *(undefined8 **)(node + 0x40); puVar4 != puVar1; puVar4 = puVar4 + 1) {
    bVar2 = handleInvalidateLocals(node,(PSNode *)*puVar4);
    bVar3 = (bool)(bVar3 | bVar2);
  }
  return bVar3;
}

Assistant:

static bool handleInvalidateLocals(PSNode *node) {
        bool changed = false;
        for (PSNode *pred : node->predecessors()) {
            changed |= handleInvalidateLocals(node, pred);
        }
        return changed;
    }